

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

bool google::protobuf::internal::DateTimeToSeconds(DateTime *time,int64 *seconds)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  long lVar8;
  int64 iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  char *__assertion;
  long lVar13;
  ulong uVar14;
  int iVar15;
  
  uVar1 = time->year;
  if (0xffffd8f0 < uVar1 - 10000) {
    uVar2 = time->month;
    uVar14 = (ulong)uVar2;
    if (0xfffffff3 < uVar2 - 0xd) {
      uVar3 = time->day;
      uVar4 = time->hour;
      uVar5 = time->minute;
      uVar6 = time->second;
      if (uVar6 < 0x3c && ((uVar5 < 0x3c && uVar4 < 0x18) && 0xffffffe0 < uVar3 - 0x20)) {
        if ((uVar2 == 2) && (bVar7 = anon_unknown_0::IsLeapYear(uVar1), bVar7)) {
          if (uVar3 < 0x1e) {
LAB_00173e04:
            if (uVar1 < 0x191) {
              uVar10 = 1;
              lVar13 = 0;
            }
            else {
              uVar10 = (ushort)((short)uVar1 - 1) / 400;
              lVar13 = (ulong)(ushort)uVar10 * 0x2f0605980;
              uVar10 = uVar10 * 400 + 1;
            }
            iVar15 = -uVar10;
            iVar12 = uVar10 - 0x12d;
            while( true ) {
              iVar11 = uVar1 + iVar15;
              if (iVar11 < 100) break;
              lVar8 = 0xbc17c200;
              if (iVar12 + (uVar10 / 400) * -400 < 0xfffffed4) {
                lVar8 = 0xbc191380;
              }
              lVar13 = lVar13 + lVar8;
              uVar10 = uVar10 + 100;
              iVar15 = iVar15 + -100;
              iVar12 = iVar12 + 100;
            }
            iVar15 = -iVar15;
            for (; 3 < iVar11; iVar11 = iVar11 + -4) {
              iVar9 = anon_unknown_0::SecondsPer4Years(iVar15);
              lVar13 = lVar13 + iVar9;
              iVar15 = iVar15 + 4;
            }
            for (; iVar15 < (int)uVar1; iVar15 = iVar15 + 1) {
              iVar9 = anon_unknown_0::SecondsPerYear(iVar15);
              lVar13 = lVar13 + iVar9;
            }
            if (uVar2 - 1 < 0xc) {
              lVar13 = (long)*(int *)((anonymous_namespace)::kDaysSinceJan + uVar14 * 4) * 0x15180 +
                       lVar13;
              if (2 < uVar2) {
                bVar7 = anon_unknown_0::IsLeapYear(iVar15);
                if (bVar7) {
                  lVar13 = lVar13 + 0x15180;
                }
              }
              if (0 < (int)uVar3) {
                if ((uVar2 == 2) && (bVar7 = anon_unknown_0::IsLeapYear(iVar15), bVar7)) {
                  iVar12 = *(int *)((anonymous_namespace)::kDaysInMonth + uVar14 * 4) + 1;
                }
                else {
                  iVar12 = *(int *)((anonymous_namespace)::kDaysInMonth + uVar14 * 4);
                }
                if ((int)uVar3 <= iVar12) {
                  *seconds = lVar13 + (ulong)uVar5 * 0x3c +
                                      (ulong)uVar4 * 0xe10 + (ulong)(uVar3 - 1) * 0x15180 +
                                      (ulong)uVar6 + -0xe7791f700;
                  return true;
                }
              }
              __assertion = 
              "time.day >= 1 && time.day <= (month == 2 && IsLeapYear(year) ? kDaysInMonth[month] + 1 : kDaysInMonth[month])"
              ;
              uVar1 = 0x7b;
            }
            else {
              __assertion = "time.month >= 1 && time.month <= 12";
              uVar1 = 0x72;
            }
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/time.cc"
                          ,uVar1,
                          "int64 google::protobuf::internal::(anonymous namespace)::SecondsSinceCommonEra(const DateTime &)"
                         );
          }
        }
        else if ((int)uVar3 <= *(int *)((anonymous_namespace)::kDaysInMonth + uVar14 * 4))
        goto LAB_00173e04;
      }
    }
  }
  return false;
}

Assistant:

bool DateTimeToSeconds(const DateTime& time, int64* seconds) {
  if (!ValidateDateTime(time)) {
    return false;
  }
  *seconds = SecondsSinceCommonEra(time) - kSecondsFromEraToEpoch;
  return true;
}